

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinCollectReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vReason,int fPiReason)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  int iPrio1;
  int iPrio0;
  int fPhase1_1;
  int fPhase0_1;
  int fPhase1;
  int fPhase0;
  int fPiReason_local;
  Vec_Int_t *vReason_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsConst1(pObj);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsNode(pObj);
          if (iVar1 == 0) {
            __assert_fail("Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                          ,0x180,
                          "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          iVar1 = Abc_LitIsCompl((pObj->field_5).iData);
          if (iVar1 == 0) {
            pAVar8 = Aig_ObjFanin0(pObj);
            uVar5 = Abc_LitIsCompl((pAVar8->field_5).iData);
            uVar6 = Aig_ObjFaninC0(pObj);
            uVar5 = uVar5 ^ uVar6;
            pAVar8 = Aig_ObjFanin1(pObj);
            uVar7 = Abc_LitIsCompl((pAVar8->field_5).iData);
            uVar6 = Aig_ObjFaninC1(pObj);
            uVar7 = uVar7 ^ uVar6;
            if ((uVar5 != 0) && (uVar7 != 0)) {
              __assert_fail("!fPhase0 || !fPhase1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                            ,0x18d,
                            "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            if ((uVar5 == 0) && (uVar7 != 0)) {
              pAVar8 = Aig_ObjFanin0(pObj);
              Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
            }
            else if ((uVar5 == 0) || (uVar7 != 0)) {
              pAVar8 = Aig_ObjFanin0(pObj);
              iVar1 = Abc_Lit2Var((pAVar8->field_5).iData);
              pAVar8 = Aig_ObjFanin1(pObj);
              iVar2 = Abc_Lit2Var((pAVar8->field_5).iData);
              if (iVar1 < iVar2) {
                pAVar8 = Aig_ObjFanin1(pObj);
                Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
              }
              else {
                pAVar8 = Aig_ObjFanin0(pObj);
                Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
              }
            }
            else {
              pAVar8 = Aig_ObjFanin1(pObj);
              Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
            }
          }
          else {
            pAVar8 = Aig_ObjFanin0(pObj);
            iVar1 = Abc_LitIsCompl((pAVar8->field_5).iData);
            iVar2 = Aig_ObjFaninC0(pObj);
            pAVar8 = Aig_ObjFanin1(pObj);
            iVar3 = Abc_LitIsCompl((pAVar8->field_5).iData);
            iVar4 = Aig_ObjFaninC1(pObj);
            if ((iVar1 == iVar2) || (iVar3 == iVar4)) {
              __assert_fail("fPhase0 && fPhase1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                            ,0x185,
                            "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            pAVar8 = Aig_ObjFanin0(pObj);
            Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
            pAVar8 = Aig_ObjFanin1(pObj);
            Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
          }
        }
      }
      else {
        pAVar8 = Aig_ObjFanin0(pObj);
        Saig_ManCexMinCollectReason_rec(p,pAVar8,vReason,fPiReason);
      }
    }
    else if ((fPiReason == 0) || (iVar1 = Saig_ObjIsPi(p,pObj), iVar1 == 0)) {
      if ((fPiReason == 0) && (iVar1 = Saig_ObjIsLo(p,pObj), iVar1 != 0)) {
        iVar1 = Saig_ObjRegId(p,pObj);
        iVar2 = Abc_LitIsCompl((pObj->field_5).iData);
        iVar1 = Abc_Var2Lit(iVar1,(uint)((iVar2 != 0 ^ 0xffU) & 1));
        Vec_IntPush(vReason,iVar1);
      }
    }
    else {
      iVar1 = Aig_ObjCioId(pObj);
      iVar2 = Abc_LitIsCompl((pObj->field_5).iData);
      iVar1 = Abc_Var2Lit(iVar1,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      Vec_IntPush(vReason,iVar1);
    }
  }
  return;
}

Assistant:

void Saig_ManCexMinCollectReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vReason, int fPiReason )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( fPiReason && Saig_ObjIsPi(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Aig_ObjCioId(pObj), !Abc_LitIsCompl(pObj->iData) ) );
        else if ( !fPiReason && Saig_ObjIsLo(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Saig_ObjRegId(p, pObj), !Abc_LitIsCompl(pObj->iData) ) );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    if ( Abc_LitIsCompl(pObj->iData) ) // value 1
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( fPhase0 && fPhase1 );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
    }
    else
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        else 
        {
            int iPrio0 = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
            int iPrio1 = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
            if ( iPrio0 >= iPrio1 )
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
            else
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        }
    }
}